

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_sub_CC(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2)

{
  TCGTemp *a2;
  TCGTemp *ts;
  TCGArg TVar1;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_3;
  TCGv_i32 ret_00;
  
  a2 = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)a2 - (long)ctx);
  ts = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  tcg_gen_sub_i32((TCGContext_conflict9 *)ctx,ret_00,r1,r2);
  tcg_gen_setcond_i32_tricore
            ((TCGContext_conflict9 *)ctx,TCG_COND_GEU,*(TCGv_i32 *)&ctx[0x1c6].pc,r1,r2);
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_xor_i32,
                      (long)&(ctx->base).tb + *(long *)&ctx[0x1c6].opcode,(TCGArg)a2,
                      (TCGArg)(r1 + (long)ctx));
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_xor_i32,(TCGArg)ts,
                      (TCGArg)(r1 + (long)ctx),(TCGArg)(r2 + (long)ctx));
  TVar1 = (long)&(ctx->base).tb + *(long *)&ctx[0x1c6].opcode;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_and_i32,TVar1,TVar1,(TCGArg)ts);
  TVar1 = (long)&(ctx->base).tb + *(long *)&ctx[0x1c6].hflags;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_or_i32,TVar1,TVar1,
                      (long)&(ctx->base).tb + *(long *)&ctx[0x1c6].opcode);
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_add_i32,
                      (long)&(ctx->base).tb + ctx[0x1c6].features,(TCGArg)a2,(TCGArg)a2);
  TVar1 = (long)&(ctx->base).tb + ctx[0x1c6].features;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_xor_i32,TVar1,(TCGArg)a2,TVar1);
  TVar1 = (long)&(ctx->base).tb + (long)&(ctx[0x1c6].uc)->arch;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_or_i32,TVar1,TVar1,
                      (long)&(ctx->base).tb + ctx[0x1c6].features);
  if (ret_00 != ret) {
    tcg_gen_op2_tricore((TCGContext_conflict9 *)ctx,INDEX_op_mov_i32,(TCGArg)(ret + (long)ctx),
                        (TCGArg)a2);
  }
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,(TCGTemp *)(ret_00 + (long)ctx));
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,ts);
  return;
}

Assistant:

static void gen_sub_CC(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 tmp;
    tcg_gen_sub_i32(tcg_ctx, tcg_ctx->cpu_NF, t0, t1);
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_ZF, tcg_ctx->cpu_NF);
    tcg_gen_setcond_i32(tcg_ctx, TCG_COND_GEU, tcg_ctx->cpu_CF, t0, t1);
    tcg_gen_xor_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF, t0);
    tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_xor_i32(tcg_ctx, tmp, t0, t1);
    tcg_gen_and_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_gen_mov_i32(tcg_ctx, dest, tcg_ctx->cpu_NF);
}